

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O1

QSet<QWidget_*> operator-(QSet<QWidget_*> *lhs,QSet<QWidget_*> *rhs)

{
  ulong uVar1;
  long *in_RDX;
  ulong uVar2;
  Data *pDVar3;
  long in_FS_OFFSET;
  QHash<QWidget_*,_QHashDummyValue> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d = (rhs->q_hash).d;
  if ((local_30.d != (Data *)0x0) &&
     (((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar3 = (Data *)*in_RDX;
  if (local_30.d == pDVar3) {
    QHash<QWidget_*,_QHashDummyValue>::clear(&local_30);
    goto LAB_0044311a;
  }
  if (pDVar3 == (Data *)0x0) {
    pDVar3 = (Data *)0x0;
LAB_00443096:
    uVar2 = 0;
  }
  else {
    if (pDVar3->spans->offsets[0] != 0xff) goto LAB_00443096;
    uVar1 = 1;
    do {
      uVar2 = uVar1;
      if (pDVar3->numBuckets == uVar2) {
        pDVar3 = (Data *)0x0;
        uVar2 = 0;
        break;
      }
      uVar1 = uVar2 + 1;
    } while (pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
  }
  if (pDVar3 != (Data *)0x0 || uVar2 != 0) {
    do {
      QHash<QWidget*,QHashDummyValue>::removeImpl<QWidget*>
                ((QHash<QWidget*,QHashDummyValue> *)&local_30,
                 (QWidget **)
                 (pDVar3->spans[uVar2 >> 7].entries +
                 pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f]));
      do {
        if (pDVar3->numBuckets - 1 == uVar2) {
          pDVar3 = (Data *)0x0;
          uVar2 = 0;
          break;
        }
        uVar2 = uVar2 + 1;
      } while (pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
    } while ((pDVar3 != (Data *)0x0) || (uVar2 != 0));
  }
LAB_0044311a:
  (lhs->q_hash).d = local_30.d;
  if ((local_30.d != (Data *)0x0) &&
     (((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QHash<QWidget_*,_QHashDummyValue>::~QHash(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (QSet<QWidget_*>)(Hash)lhs;
}

Assistant:

friend QSet operator-(const QSet &lhs, const QSet &rhs) { return QSet(lhs) -= rhs; }